

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_bin_le.c
# Opt level: O3

void test_read_format_cpio_bin_le(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *v1;
  la_int64_t lVar4;
  time_t v1_00;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_cpio_bin_le.cpio");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                   ,L'\"',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'#',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'$',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_cpio_bin_le.cpio",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'&',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reference, 10)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  v1 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
             ,L'(',v1,"archive_entry_pathname(ae)","file1111222233334444","\"file1111222233334444\""
             ,(void *)0x0,L'\0');
  lVar4 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L')',lVar4,"archive_entry_size(ae)",5,"5",(void *)0x0);
  v1_00 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'*',v1_00,"archive_entry_mtime(ae)",0x49f3086f,"1240664175",(void *)0x0);
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'+',(ulong)mVar3,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  lVar4 = archive_entry_uid(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L',',lVar4,"archive_entry_uid(ae)",1000,"1000",(void *)0x0);
  lVar4 = archive_entry_gid(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'-',lVar4,"archive_entry_gid(ae)",0,"0",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'.',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'/',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'1',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                      (void *)0x0);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'2',(long)iVar1,"archive_format(a)",0x10002,"ARCHIVE_FORMAT_CPIO_BIN_LE",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'3',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_bin_le.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_bin_le)
{
	struct archive_entry *ae;
	struct archive *a;
	const char *reference = "test_read_format_cpio_bin_le.cpio";

	extract_reference_file(reference);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reference, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "file1111222233334444");
	assertEqualInt(archive_entry_size(ae), 5);
	assertEqualInt(archive_entry_mtime(ae), 1240664175);
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_uid(ae), 1000);
	assertEqualInt(archive_entry_gid(ae), 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_NONE);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_BIN_LE);
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}